

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O0

void __thiscall
sc_core::sc_in<sc_dt::sc_logic>::add_trace_internal
          (sc_in<sc_dt::sc_logic> *this,sc_trace_file *tf_,string *name_)

{
  value_type *__x;
  long in_RSI;
  long in_RDI;
  sc_trace_file *in_stack_ffffffffffffffa8;
  sc_trace_params *this_00;
  vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
  *in_stack_ffffffffffffffc0;
  
  if (in_RSI != 0) {
    if (*(long *)(in_RDI + 0x98) == 0) {
      in_stack_ffffffffffffffc0 =
           (vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_> *)
           operator_new(0x18);
      std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>::vector
                ((vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_> *)
                 0x238c42);
      *(vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_> **)
       (in_RDI + 0x98) = in_stack_ffffffffffffffc0;
    }
    this_00 = *(sc_trace_params **)(in_RDI + 0x98);
    __x = (value_type *)operator_new(0x28);
    sc_trace_params::sc_trace_params(this_00,in_stack_ffffffffffffffa8,(string *)0x238ca6);
    std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>::push_back
              (in_stack_ffffffffffffffc0,__x);
  }
  return;
}

Assistant:

void
sc_in<sc_dt::sc_logic>::add_trace_internal( sc_trace_file* tf_,
    const std::string& name_ ) const
{
    if( tf_ != 0 ) {
	if( m_traces == 0 ) {
	    m_traces = new sc_trace_params_vec;
	}
	m_traces->push_back( new sc_trace_params( tf_, name_ ) );
    }
}